

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::SetArgsFromPreset(cmCTest *this,string *presetName,bool listPresets)

{
  _Base_ptr __k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  byte bVar4;
  int iVar5;
  _Rb_tree_color _Var6;
  _Base_ptr p_Var7;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var8;
  ReadFileResult result;
  char *__s;
  iterator iVar9;
  iterator iVar10;
  undefined8 uVar11;
  long *plVar12;
  bool bVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int iVar16;
  _Alloc_hider _Var17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *kvp;
  _Base_ptr p_Var18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view separator;
  string indexOptions;
  string workingDirectory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  presetEnvironment;
  cmCMakePresetsGraph settingsFile;
  string local_2e0;
  undefined1 local_2b0 [16];
  _Rb_tree_node_base local_2a0;
  size_t local_280;
  char *local_278;
  undefined8 local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  string local_260;
  string local_240;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  cmCMakePresetsGraph local_1f0;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  local_1f0.errors._M_dataplus._M_p = (pointer)&local_1f0.errors.field_2;
  local_1f0.errors._M_string_length = 0;
  local_1f0.errors.field_2._M_local_buf[0] = '\0';
  p_Var2 = &local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header;
  local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header;
  local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0.SourceDir._M_dataplus._M_p = (pointer)&local_1f0.SourceDir.field_2;
  local_1f0.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.SourceDir._M_string_length = 0;
  local_1f0.SourceDir.field_2._M_local_buf[0] = '\0';
  local_1f0.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  local_1f0.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_1f0.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  result = cmCMakePresetsGraph::ReadProjectPresets(&local_1f0,&local_240,false);
  _Var17._M_p = local_240._M_dataplus._M_p;
  if (result != READ_OK) {
    __s = cmCMakePresetsGraph::ResultToString(result);
    local_2b0._0_8_ = (_Base_ptr)0x1c;
    local_2b0._8_8_ = "Could not read presets from ";
    local_2a0._0_8_ = local_240._M_string_length;
    local_2a0._M_parent = (_Base_ptr)_Var17._M_p;
    local_2a0._M_left = (_Base_ptr)&DAT_00000002;
    local_2a0._M_right = (_Base_ptr)0x7918c1;
    local_280 = strlen(__s);
    views._M_len = 4;
    views._M_array = (iterator)local_2b0;
    local_278 = __s;
    cmCatViews_abi_cxx11_((string *)local_220,views);
    cmSystemTools::Error((string *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != local_210) {
      uVar11 = CONCAT71(local_210[0]._M_allocated_capacity._1_7_,local_210[0]._M_local_buf[0]);
      _Var17._M_p = (pointer)local_220._0_8_;
LAB_0016f83b:
      operator_delete(_Var17._M_p,uVar11 + 1);
    }
LAB_0016f843:
    bVar13 = false;
    goto LAB_0016fb8e;
  }
  if (listPresets) {
    bVar13 = true;
    cmCMakePresetsGraph::PrintTestPresetList(&local_1f0,(PrintPrecedingNewline *)0x0);
    goto LAB_0016fb8e;
  }
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
          ::find(&local_1f0.TestPresets._M_t,presetName);
  if ((_Rb_tree_header *)iVar9._M_node == p_Var3) {
    local_2b0._0_8_ = (_Base_ptr)0x17;
    local_2b0._8_8_ = "No such test preset in ";
    local_2a0._0_8_ = local_240._M_string_length;
    local_2a0._M_parent = (_Base_ptr)local_240._M_dataplus._M_p;
    local_2a0._M_left = (_Base_ptr)0x3;
    local_2a0._M_right = (_Base_ptr)0x79dcfd;
    local_278 = (presetName->_M_dataplus)._M_p;
    local_280 = presetName->_M_string_length;
    local_268 = local_210;
    local_220._0_8_ = &DAT_00000001;
    local_210[0]._M_local_buf[0] = '\"';
    local_270 = 1;
    views_01._M_len = 5;
    views_01._M_array = (iterator)local_2b0;
    local_220._8_8_ = local_268;
    cmCatViews_abi_cxx11_(&local_2e0,views_01);
    cmSystemTools::Error(&local_2e0);
  }
  else {
    if ((char)iVar9._M_node[4]._M_color != _S_black) {
      if (*(char *)&iVar9._M_node[0x3a]._M_left == '\0') {
        local_2a0._M_parent = (_Base_ptr)(presetName->_M_dataplus)._M_p;
        local_2a0._0_8_ = presetName->_M_string_length;
        local_2b0._0_8_ = (_Base_ptr)0x20;
        local_2b0._8_8_ = "Could not evaluate test preset \"";
        local_2a0._M_left = (_Base_ptr)0x1a;
        local_2a0._M_right = (_Base_ptr)0x74fcbd;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_2b0;
        cmCatViews_abi_cxx11_((string *)local_220,views_02);
        cmSystemTools::Error((string *)local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._0_8_ != local_210) {
          uVar11 = CONCAT71(local_210[0]._M_allocated_capacity._1_7_,local_210[0]._M_local_buf[0]);
          _Var17._M_p = (pointer)local_220._0_8_;
LAB_0016fb75:
          operator_delete(_Var17._M_p,uVar11 + 1);
        }
      }
      else {
        if (*(char *)&iVar9._M_node[0x23]._M_parent != '\0') {
          __k = iVar9._M_node + 0x25;
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                   ::find(&local_1f0.ConfigurePresets._M_t,__k);
          if ((_Rb_tree_header *)iVar10._M_node == p_Var2) {
            local_2b0._0_8_ = (_Base_ptr)0x1c;
            local_2b0._8_8_ = "No such configure preset in ";
            local_220._0_8_ = local_240._M_string_length;
            local_220._8_8_ = local_240._M_dataplus._M_p;
            local_260._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_2e0,(cmAlphaNum *)local_2b0,(cmAlphaNum *)local_220,
                       (char (*) [4])0x79dcfd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                       (char *)&local_260);
            cmSystemTools::Error(&local_2e0);
          }
          else {
            if ((char)iVar10._M_node[4]._M_color != _S_black) {
              if ((char)iVar10._M_node[0x21]._M_color == _S_red) {
                local_2b0._0_8_ = (_Base_ptr)0x25;
                local_2b0._8_8_ = "Could not evaluate configure preset \"";
                local_220._8_8_ = *(undefined8 *)(iVar9._M_node + 0x25);
                local_220._0_8_ = iVar9._M_node[0x25]._M_parent;
                cmStrCat<char[27]>(&local_2e0,(cmAlphaNum *)local_2b0,(cmAlphaNum *)local_220,
                                   (char (*) [27])"\": Invalid macro expansion");
                cmSystemTools::Error(&local_2e0);
                uVar11 = local_2e0.field_2._M_allocated_capacity;
                _Var17._M_p = local_2e0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_0016f83b;
                goto LAB_0016f843;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_220,
                         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&iVar9._M_node[0x23]._M_left);
              if ((_Rb_tree_node_base *)local_210[0]._8_8_ != (_Rb_tree_node_base *)(local_220 + 8))
              {
                uVar11 = local_210[0]._8_8_;
                do {
                  if ((char)((_Rb_tree_node_base *)(uVar11 + 0x60))->_M_color == _S_black) {
                    local_2b0._8_8_ = *(undefined8 *)(uVar11 + 0x20);
                    local_2b0._0_8_ = ((_Rb_tree_node_base *)(uVar11 + 0x20))->_M_parent;
                    local_2e0._M_dataplus._M_p = &DAT_00000001;
                    local_2e0._M_string_length = (size_type)&local_2e0.field_2;
                    local_2e0.field_2._M_local_buf[0] = 0x3d;
                    local_2a0._0_8_ = &DAT_00000001;
                    local_2a0._M_right = *(_Base_ptr *)(uVar11 + 0x40);
                    local_2a0._M_left = ((_Rb_tree_node_base *)(uVar11 + 0x40))->_M_parent;
                    views_03._M_len = 3;
                    views_03._M_array = (iterator)local_2b0;
                    local_2a0._M_parent = (_Base_ptr)local_2e0._M_string_length;
                    cmCatViews_abi_cxx11_(&local_260,views_03);
                    cmsys::SystemTools::PutEnv(&local_260);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                  }
                  uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
                } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)(local_220 + 8));
              }
              if (iVar9._M_node[0x26]._M_left != (_Base_ptr)0x0) {
                SetConfigType(this,(string *)&iVar9._M_node[0x26]._M_parent);
              }
              local_2a0._M_parent = iVar10._M_node[0x1c]._M_right;
              local_2a0._0_8_ = *(undefined8 *)(iVar10._M_node + 0x1d);
              local_2b0._0_8_ = (_Base_ptr)0xf;
              local_2b0._8_8_ = "BuildDirectory=";
              views_04._M_len = 2;
              views_04._M_array = (iterator)local_2b0;
              cmCatViews_abi_cxx11_(&local_2e0,views_04);
              AddCTestConfigurationOverwrite(this,&local_2e0);
              paVar1 = &local_2e0.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != paVar1) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                local_2e0.field_2._M_allocated_capacity + 1);
              }
              p_Var7 = iVar9._M_node[0x27]._M_left;
              for (p_Var18 = iVar9._M_node[0x27]._M_parent; p_Var18 != p_Var7; p_Var18 = p_Var18 + 1
                  ) {
                AddCTestConfigurationOverwrite(this,(string *)p_Var18);
              }
              if ((char)iVar9._M_node[0x2c]._M_color != _S_red) {
                _Var8._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var8._M_head_impl)->TestProgressOutput =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x28]._M_color + 1) &
                           (char)iVar9._M_node[0x28]._M_color);
                if (*(char *)&iVar9._M_node[0x28]._M_parent == '\x01') {
                  if (*(int *)&iVar9._M_node[0x28].field_0x4 != 1) {
                    if (*(int *)&iVar9._M_node[0x28].field_0x4 != 2) goto LAB_0016fe9b;
                    (_Var8._M_head_impl)->ExtraVerbose = true;
                  }
                  (_Var8._M_head_impl)->Verbose = true;
                }
LAB_0016fe9b:
                bVar4 = *(byte *)((long)&iVar9._M_node[0x28]._M_parent + 5);
                (_Var8._M_head_impl)->Debug =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x28]._M_parent + 4) & bVar4);
                (_Var8._M_head_impl)->ShowLineNumbers =
                     (bool)(bVar4 & *(byte *)((long)&iVar9._M_node[0x28]._M_parent + 4));
                (_Var8._M_head_impl)->OutputTestOutputOnTestFailure =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x28]._M_parent + 7) &
                           *(byte *)((long)&iVar9._M_node[0x28]._M_parent + 6));
                (_Var8._M_head_impl)->Quiet =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x28]._M_left + 1) &
                           *(byte *)&iVar9._M_node[0x28]._M_left);
                if (*(long *)(iVar9._M_node + 0x29) != 0) {
                  SetOutputLogFileName(this,(string *)&iVar9._M_node[0x28]._M_right);
                }
                if (*(long *)(iVar9._M_node + 0x2a) != 0) {
                  cmCTestTestHandler::SetJUnitXMLFileName
                            (&((this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                              TestHandler,(string *)&iVar9._M_node[0x29]._M_right);
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                  CompressTestOutput = false;
                }
                bVar13 = (bool)(*(byte *)&iVar9._M_node[0x2a]._M_right & 1);
                _Var8._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                if (*(char *)((long)&iVar9._M_node[0x2a]._M_right + 1) == '\0') {
                  bVar13 = true;
                }
                (_Var8._M_head_impl)->LabelSummary = bVar13;
                bVar13 = (bool)(*(byte *)((long)&iVar9._M_node[0x2a]._M_right + 2) & 1);
                if (*(char *)((long)&iVar9._M_node[0x2a]._M_right + 3) == '\0') {
                  bVar13 = true;
                }
                (_Var8._M_head_impl)->SubprojectSummary = bVar13;
                if ((char)iVar9._M_node[0x2b]._M_color == _S_black) {
                  *(int *)((long)&(_Var8._M_head_impl)->TestHandler + 0x1ac) =
                       *(int *)((long)&iVar9._M_node[0x2a]._M_right + 4);
                }
                if (*(char *)&iVar9._M_node[0x2b]._M_parent == '\x01') {
                  *(int *)((long)&(_Var8._M_head_impl)->TestHandler + 0x1b0) =
                       *(int *)&iVar9._M_node[0x2b].field_0x4;
                }
                if (*(char *)&iVar9._M_node[0x2b]._M_left == '\x01') {
                  *(TruncationMode *)((long)&(_Var8._M_head_impl)->TestHandler + 0x1b4) =
                       *(TruncationMode *)((long)&iVar9._M_node[0x2b]._M_parent + 4);
                }
                if (*(char *)&iVar9._M_node[0x2b]._M_right == '\x01') {
                  (_Var8._M_head_impl)->MaxTestNameWidth =
                       *(int *)((long)&iVar9._M_node[0x2b]._M_left + 4);
                }
              }
              if ((char)iVar9._M_node[0x37]._M_color == _S_black) {
                if (*(char *)&iVar9._M_node[0x31]._M_parent == '\x01') {
                  p_Var18 = (_Base_ptr)(local_2b0 + 0x10);
                  local_2b0._0_8_ = p_Var18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2b0,"IncludeRegularExpression","");
                  SetPersistentOptionIfNotEmpty
                            (this,(string *)&iVar9._M_node[0x2c]._M_parent,(string *)local_2b0);
                  if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                  }
                  local_2b0._0_8_ = p_Var18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2b0,"LabelRegularExpression","");
                  AddPersistentMultiOptionIfNotEmpty
                            (this,(string *)&iVar9._M_node[0x2d]._M_parent,(string *)local_2b0);
                  if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                  }
                  if (*(char *)&iVar9._M_node[0x30]._M_right == '\x01') {
                    if (*(long *)(iVar9._M_node + 0x30) == 0) {
                      local_2b0._8_8_ = (char *)0x0;
                      local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffffffffff00;
                      if (*(char *)((long)&iVar9._M_node[0x2e]._M_parent + 4) == '\x01') {
                        local_2b0._0_8_ = p_Var18;
                        std::__cxx11::to_string(&local_260,*(int *)&iVar9._M_node[0x2e]._M_parent);
                      }
                      else {
                        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                        local_2b0._0_8_ = p_Var18;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
                      }
                      plVar12 = (long *)std::__cxx11::string::append((char *)&local_260);
                      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(plVar12 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar12 == paVar14) {
                        local_2e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                        local_2e0.field_2._8_8_ = plVar12[3];
                        local_2e0._M_dataplus._M_p = (pointer)paVar1;
                      }
                      else {
                        local_2e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                        local_2e0._M_dataplus._M_p = (pointer)*plVar12;
                      }
                      local_2e0._M_string_length = plVar12[1];
                      *plVar12 = (long)paVar14;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      std::__cxx11::string::_M_append(local_2b0,(ulong)local_2e0._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                      paVar14 = &local_260.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_260._M_dataplus._M_p != paVar14) {
                        operator_delete(local_260._M_dataplus._M_p,
                                        local_260.field_2._M_allocated_capacity + 1);
                      }
                      if (*(char *)((long)&iVar9._M_node[0x2e]._M_left + 4) == '\x01') {
                        std::__cxx11::to_string(&local_260,*(int *)&iVar9._M_node[0x2e]._M_left);
                      }
                      else {
                        local_260._M_dataplus._M_p = (pointer)paVar14;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
                      }
                      plVar12 = (long *)std::__cxx11::string::append((char *)&local_260);
                      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(plVar12 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar12 == paVar15) {
                        local_2e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                        local_2e0.field_2._8_8_ = plVar12[3];
                        local_2e0._M_dataplus._M_p = (pointer)paVar1;
                      }
                      else {
                        local_2e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                        local_2e0._M_dataplus._M_p = (pointer)*plVar12;
                      }
                      local_2e0._M_string_length = plVar12[1];
                      *plVar12 = (long)paVar15;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      std::__cxx11::string::_M_append(local_2b0,(ulong)local_2e0._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_260._M_dataplus._M_p != paVar14) {
                        operator_delete(local_260._M_dataplus._M_p,
                                        local_260.field_2._M_allocated_capacity + 1);
                      }
                      if (*(char *)((long)&iVar9._M_node[0x2e]._M_right + 4) == '\x01') {
                        std::__cxx11::to_string(&local_260,*(int *)&iVar9._M_node[0x2e]._M_right);
                      }
                      else {
                        local_260._M_dataplus._M_p = (pointer)paVar14;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
                      }
                      plVar12 = (long *)std::__cxx11::string::append((char *)&local_260);
                      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(plVar12 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar12 == paVar15) {
                        local_2e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                        local_2e0.field_2._8_8_ = plVar12[3];
                        local_2e0._M_dataplus._M_p = (pointer)paVar1;
                      }
                      else {
                        local_2e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                        local_2e0._M_dataplus._M_p = (pointer)*plVar12;
                      }
                      local_2e0._M_string_length = plVar12[1];
                      *plVar12 = (long)paVar15;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      std::__cxx11::string::_M_append(local_2b0,(ulong)local_2e0._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_260._M_dataplus._M_p != paVar14) {
                        operator_delete(local_260._M_dataplus._M_p,
                                        local_260.field_2._M_allocated_capacity + 1);
                      }
                      separator._M_str = ",";
                      separator._M_len = 1;
                      cmJoin<std::vector<int,std::allocator<int>>>
                                (&local_2e0,
                                 (vector<int,_std::allocator<int>_> *)(iVar9._M_node + 0x2f),
                                 separator);
                      std::__cxx11::string::_M_append(local_2b0,(ulong)local_2e0._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                      local_2e0._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_2e0,"TestsToRunInformation","");
                      SetPersistentOptionIfNotEmpty(this,(string *)local_2b0,&local_2e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2e0._M_dataplus._M_p != paVar1) {
                        operator_delete(local_2e0._M_dataplus._M_p,
                                        local_2e0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      local_2b0._0_8_ = p_Var18;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2b0,"TestsToRunInformation","");
                      SetPersistentOptionIfNotEmpty
                                (this,(string *)&iVar9._M_node[0x2f]._M_right,(string *)local_2b0);
                    }
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                  }
                  if ((*(byte *)((long)&iVar9._M_node[0x31]._M_color + 1) == 1) &&
                     ((iVar9._M_node[0x31]._M_color & _S_black) != _S_red)) {
                    _Var8._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_2b0._0_8_ = p_Var18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,"UseUnion","");
                    cmCTestGenericHandler::SetPersistentOption
                              (&((_Var8._M_head_impl)->TestHandler).super_cmCTestGenericHandler,
                               (string *)local_2b0,"true");
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                    _Var8._M_head_impl =
                         (this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                    local_2b0._0_8_ = p_Var18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,"UseUnion","");
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)&(_Var8._M_head_impl)->MemCheckHandler,
                               (string *)local_2b0,"true");
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                  }
                }
                if (*(char *)&iVar9._M_node[0x36]._M_right == '\x01') {
                  p_Var18 = (_Base_ptr)(local_2b0 + 0x10);
                  local_2b0._0_8_ = p_Var18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2b0,"ExcludeRegularExpression","");
                  SetPersistentOptionIfNotEmpty
                            (this,(string *)&iVar9._M_node[0x31]._M_left,(string *)local_2b0);
                  if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                  }
                  local_2b0._0_8_ = p_Var18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2b0,"ExcludeLabelRegularExpression","");
                  AddPersistentMultiOptionIfNotEmpty
                            (this,(string *)&iVar9._M_node[0x32]._M_left,(string *)local_2b0);
                  if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                  }
                  if (*(char *)&iVar9._M_node[0x36]._M_left == '\x01') {
                    local_2b0._0_8_ = p_Var18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,"ExcludeFixtureRegularExpression","");
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar9._M_node[0x33]._M_left,(string *)local_2b0);
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                    local_2b0._0_8_ = p_Var18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,"ExcludeFixtureSetupRegularExpression","");
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar9._M_node[0x34]._M_left,(string *)local_2b0);
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                    local_2b0._0_8_ = p_Var18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2b0,"ExcludeFixtureCleanupRegularExpression","");
                    SetPersistentOptionIfNotEmpty
                              (this,(string *)&iVar9._M_node[0x35]._M_left,(string *)local_2b0);
                    if ((_Base_ptr)local_2b0._0_8_ != p_Var18) {
                      operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                    }
                  }
                }
              }
              if (*(char *)&iVar9._M_node[0x3a]._M_parent == '\x01') {
                _Var8._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var8._M_head_impl)->StopOnFailure =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x37]._M_parent + 1) &
                           *(byte *)&iVar9._M_node[0x37]._M_parent);
                (_Var8._M_head_impl)->Failover =
                     (bool)(*(byte *)((long)&iVar9._M_node[0x37]._M_parent + 3) &
                           *(byte *)((long)&iVar9._M_node[0x37]._M_parent + 2));
                if (*(char *)&iVar9._M_node[0x37]._M_left == '\x01') {
                  iVar5 = *(int *)((long)&iVar9._M_node[0x37]._M_parent + 4);
                  iVar16 = 1;
                  if (1 < iVar5) {
                    iVar16 = iVar5;
                  }
                  (_Var8._M_head_impl)->ParallelLevel = iVar16;
                  (_Var8._M_head_impl)->ParallelLevelSetInCli = true;
                }
                local_2b0._0_8_ = (_Base_ptr)(local_2b0 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b0,"ResourceSpecFile","");
                SetPersistentOptionIfNotEmpty
                          (this,(string *)&iVar9._M_node[0x37]._M_right,(string *)local_2b0);
                if ((_Base_ptr)local_2b0._0_8_ != (_Base_ptr)(local_2b0 + 0x10)) {
                  operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
                }
                if (*(char *)((long)&iVar9._M_node[0x38]._M_right + 4) == '\x01') {
                  ((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestLoad =
                       (long)*(int *)&iVar9._M_node[0x38]._M_right;
                }
                if (iVar9._M_node[0x39].field_0x4 == '\x01') {
                  _Var8._M_head_impl =
                       (this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                  (_Var8._M_head_impl)->ShowOnly = true;
                  if (iVar9._M_node[0x39]._M_color == _S_black) {
                    (_Var8._M_head_impl)->Quiet = true;
                    (_Var8._M_head_impl)->OutputAsJson = true;
                    (_Var8._M_head_impl)->OutputAsJsonVersion = 1;
                  }
                }
                if (*(char *)&iVar9._M_node[0x39]._M_left != '\x01') {
LAB_00170773:
                  if (*(char *)((long)&iVar9._M_node[0x39]._M_left + 5) == '\x01') {
                    ((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                    InteractiveDebugMode = *(bool *)((long)&iVar9._M_node[0x39]._M_left + 4);
                  }
                  if ((*(char *)((long)&iVar9._M_node[0x39]._M_left + 7) == '\x01') &&
                     (((ulong)iVar9._M_node[0x39]._M_left & 0x1000000000000) != 0)) {
                    std::__cxx11::string::operator=
                              ((string *)
                               &((this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                                ScheduleType,"Random");
                  }
                  if (*(char *)((long)&iVar9._M_node[0x39]._M_right + 4) == '\x01') {
                    (((this->Impl)._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->GlobalTimeout
                    ).__r = (double)*(int *)&iVar9._M_node[0x39]._M_right;
                  }
                  if (iVar9._M_node[0x3a].field_0x4 == '\x01') {
                    _Var6 = iVar9._M_node[0x3a]._M_color;
                    if (_Var6 - _S_black < 2) {
                      ((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->NoTestsMode
                           = _Var6;
                    }
                    else if (_Var6 != _S_red) goto LAB_0017080e;
                  }
                  goto LAB_001707fa;
                }
                _Var8._M_head_impl =
                     (this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
                (_Var8._M_head_impl)->RepeatCount =
                     *(undefined4 *)((long)&iVar9._M_node[0x39]._M_parent + 4);
                if (*(uint *)&iVar9._M_node[0x39]._M_parent < 3) {
                  (_Var8._M_head_impl)->RepeatMode =
                       *(uint *)&iVar9._M_node[0x39]._M_parent + UntilFail;
                  goto LAB_00170773;
                }
LAB_0017080e:
                bVar13 = false;
              }
              else {
LAB_001707fa:
                bVar13 = true;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_220);
              goto LAB_0016fb8e;
            }
            local_2b0._0_8_ = (_Base_ptr)0x26;
            local_2b0._8_8_ = "Cannot use hidden configure preset in ";
            local_220._0_8_ = local_240._M_string_length;
            local_220._8_8_ = local_240._M_dataplus._M_p;
            local_260._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_2e0,(cmAlphaNum *)local_2b0,(cmAlphaNum *)local_220,
                       (char (*) [4])0x79dcfd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                       (char *)&local_260);
            cmSystemTools::Error(&local_2e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          bVar13 = false;
          cmCMakePresetsGraph::PrintConfigurePresetList(&local_1f0,(PrintPrecedingNewline *)0x0);
          goto LAB_0016fb8e;
        }
        local_2b0._0_8_ = (_Base_ptr)0x23;
        local_2b0._8_8_ = "Cannot use disabled test preset in ";
        local_220._0_8_ = local_240._M_string_length;
        local_220._8_8_ = local_240._M_dataplus._M_p;
        local_260._M_dataplus._M_p._0_1_ = 0x22;
        cmStrCat<char[4],std::__cxx11::string,char>
                  (&local_2e0,(cmAlphaNum *)local_2b0,(cmAlphaNum *)local_220,(char (*) [4])0x79dcfd
                   ,presetName,(char *)&local_260);
        cmSystemTools::Error(&local_2e0);
        uVar11 = local_2e0.field_2._M_allocated_capacity;
        _Var17._M_p = local_2e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_0016fb75;
      }
      bVar13 = false;
      cmCMakePresetsGraph::PrintTestPresetList(&local_1f0,(PrintPrecedingNewline *)0x0);
      goto LAB_0016fb8e;
    }
    local_2b0._0_8_ = (_Base_ptr)0x21;
    local_2b0._8_8_ = "Cannot use hidden test preset in ";
    local_2a0._0_8_ = local_240._M_string_length;
    local_2a0._M_parent = (_Base_ptr)local_240._M_dataplus._M_p;
    local_2a0._M_left = (_Base_ptr)0x3;
    local_2a0._M_right = (_Base_ptr)0x79dcfd;
    local_278 = (presetName->_M_dataplus)._M_p;
    local_280 = presetName->_M_string_length;
    local_268 = local_210;
    local_220._0_8_ = &DAT_00000001;
    local_210[0]._M_local_buf[0] = '\"';
    local_270 = 1;
    views_00._M_len = 5;
    views_00._M_array = (iterator)local_2b0;
    local_220._8_8_ = local_268;
    cmCatViews_abi_cxx11_(&local_2e0,views_00);
    cmSystemTools::Error(&local_2e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  bVar13 = false;
  cmCMakePresetsGraph::PrintTestPresetList(&local_1f0,(PrintPrecedingNewline *)0x0);
LAB_0016fb8e:
  cmCMakePresetsGraph::~cmCMakePresetsGraph(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  return bVar13;
}

Assistant:

bool cmCTest::SetArgsFromPreset(const std::string& presetName,
                                bool listPresets)
{
  const auto workingDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(workingDirectory);
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", workingDirectory, ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return false;
  }

  if (listPresets) {
    settingsFile.PrintTestPresetList();
    return true;
  }

  auto presetPair = settingsFile.TestPresets.find(presetName);
  if (presetPair == settingsFile.TestPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such test preset in ", workingDirectory,
                                  ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate test preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto configurePresetPair =
    settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
  if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
    cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  if (configurePresetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
  if (!expandedConfigurePreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                  expandedPreset->ConfigurePreset,
                                  "\": Invalid macro expansion"));
    return false;
  }

  auto presetEnvironment = expandedPreset->Environment;
  for (auto const& var : presetEnvironment) {
    if (var.second) {
      cmSystemTools::PutEnv(cmStrCat(var.first, '=', *var.second));
    }
  }

  if (!expandedPreset->Configuration.empty()) {
    this->SetConfigType(expandedPreset->Configuration);
  }

  // Set build directory to value specified by the configure preset.
  this->AddCTestConfigurationOverwrite(
    cmStrCat("BuildDirectory=", expandedConfigurePreset->BinaryDir));
  for (const auto& kvp : expandedPreset->OverwriteConfigurationFile) {
    this->AddCTestConfigurationOverwrite(kvp);
  }

  if (expandedPreset->Output) {
    this->Impl->TestProgressOutput =
      expandedPreset->Output->ShortProgress.value_or(false);

    if (expandedPreset->Output->Verbosity) {
      const auto& verbosity = *expandedPreset->Output->Verbosity;
      switch (verbosity) {
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Extra:
          this->Impl->ExtraVerbose = true;
          CM_FALLTHROUGH;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Verbose:
          this->Impl->Verbose = true;
          break;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Default:
        default:
          // leave default settings
          break;
      }
    }

    this->Impl->Debug = expandedPreset->Output->Debug.value_or(false);
    this->Impl->ShowLineNumbers =
      expandedPreset->Output->Debug.value_or(false);
    this->Impl->OutputTestOutputOnTestFailure =
      expandedPreset->Output->OutputOnFailure.value_or(false);
    this->Impl->Quiet = expandedPreset->Output->Quiet.value_or(false);

    if (!expandedPreset->Output->OutputLogFile.empty()) {
      this->SetOutputLogFileName(expandedPreset->Output->OutputLogFile);
    }
    if (!expandedPreset->Output->OutputJUnitFile.empty()) {
      this->SetOutputJUnitFileName(expandedPreset->Output->OutputJUnitFile);
    }

    this->Impl->LabelSummary =
      expandedPreset->Output->LabelSummary.value_or(true);
    this->Impl->SubprojectSummary =
      expandedPreset->Output->SubprojectSummary.value_or(true);

    if (expandedPreset->Output->MaxPassedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        *expandedPreset->Output->MaxPassedTestOutputSize);
    }

    if (expandedPreset->Output->MaxFailedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        *expandedPreset->Output->MaxFailedTestOutputSize);
    }

    if (expandedPreset->Output->TestOutputTruncation) {
      this->Impl->TestHandler.TestOutputTruncation =
        *expandedPreset->Output->TestOutputTruncation;
    }

    if (expandedPreset->Output->MaxTestNameWidth) {
      this->Impl->MaxTestNameWidth = *expandedPreset->Output->MaxTestNameWidth;
    }
  }

  if (expandedPreset->Filter) {
    if (expandedPreset->Filter->Include) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Include->Name, "IncludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Include->Label, "LabelRegularExpression");

      if (expandedPreset->Filter->Include->Index) {
        if (expandedPreset->Filter->Include->Index->IndexFile.empty()) {
          const auto& start = expandedPreset->Filter->Include->Index->Start;
          const auto& end = expandedPreset->Filter->Include->Index->End;
          const auto& stride = expandedPreset->Filter->Include->Index->Stride;
          std::string indexOptions;
          indexOptions += (start ? std::to_string(*start) : "") + ",";
          indexOptions += (end ? std::to_string(*end) : "") + ",";
          indexOptions += (stride ? std::to_string(*stride) : "") + ",";
          indexOptions +=
            cmJoin(expandedPreset->Filter->Include->Index->SpecificTests, ",");

          this->SetPersistentOptionIfNotEmpty(indexOptions,
                                              "TestsToRunInformation");
        } else {
          this->SetPersistentOptionIfNotEmpty(
            expandedPreset->Filter->Include->Index->IndexFile,
            "TestsToRunInformation");
        }
      }

      if (expandedPreset->Filter->Include->UseUnion.value_or(false)) {
        this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
        this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
      }
    }

    if (expandedPreset->Filter->Exclude) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Name, "ExcludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Label,
        "ExcludeLabelRegularExpression");

      if (expandedPreset->Filter->Exclude->Fixtures) {
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Any,
          "ExcludeFixtureRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Setup,
          "ExcludeFixtureSetupRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Cleanup,
          "ExcludeFixtureCleanupRegularExpression");
      }
    }
  }

  if (expandedPreset->Execution) {
    this->Impl->StopOnFailure =
      expandedPreset->Execution->StopOnFailure.value_or(false);
    this->Impl->Failover =
      expandedPreset->Execution->EnableFailover.value_or(false);

    if (expandedPreset->Execution->Jobs) {
      auto jobs = *expandedPreset->Execution->Jobs;
      this->SetParallelLevel(jobs);
      this->Impl->ParallelLevelSetInCli = true;
    }

    this->SetPersistentOptionIfNotEmpty(
      expandedPreset->Execution->ResourceSpecFile, "ResourceSpecFile");

    if (expandedPreset->Execution->TestLoad) {
      auto testLoad = *expandedPreset->Execution->TestLoad;
      this->SetTestLoad(testLoad);
    }

    if (expandedPreset->Execution->ShowOnly) {
      this->Impl->ShowOnly = true;

      switch (*expandedPreset->Execution->ShowOnly) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          JsonV1:
          this->Impl->Quiet = true;
          this->Impl->OutputAsJson = true;
          this->Impl->OutputAsJsonVersion = 1;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          Human:
          // intentional fallthrough (human is the default)
        default:
          break;
      }
    }

    if (expandedPreset->Execution->Repeat) {
      this->Impl->RepeatCount = expandedPreset->Execution->Repeat->Count;
      switch (expandedPreset->Execution->Repeat->Mode) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilFail:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilPass:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::AfterTimeout:
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
          break;
        default:
          // should never default since mode is required
          return false;
      }
    }

    if (expandedPreset->Execution->InteractiveDebugging) {
      this->Impl->InteractiveDebugMode =
        *expandedPreset->Execution->InteractiveDebugging;
    }

    if (expandedPreset->Execution->ScheduleRandom.value_or(false)) {
      this->Impl->ScheduleType = "Random";
    }

    if (expandedPreset->Execution->Timeout) {
      this->Impl->GlobalTimeout =
        cmDuration(*expandedPreset->Execution->Timeout);
    }

    if (expandedPreset->Execution->NoTestsAction) {
      switch (*expandedPreset->Execution->NoTestsAction) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Error:
          this->Impl->NoTestsMode = cmCTest::NoTests::Error;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Ignore:
          this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Default:
          break;
        default:
          // should never default
          return false;
      }
    }
  }

  return true;
}